

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadDouble(ON_BinaryArchive *this,size_t count,double *p)

{
  size_t count_00;
  double dVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  size_t sVar22;
  size_t sVar23;
  undefined1 auVar24 [16];
  
  count_00 = count * 8;
  sVar22 = Read(this,count_00,p);
  if ((count != 0 && sVar22 == count_00) && this->m_endian == big_endian) {
    sVar23 = 0;
    do {
      dVar1 = p[sVar23];
      auVar10._8_6_ = 0;
      auVar10._0_8_ = dVar1;
      auVar10[0xe] = (char)((ulong)dVar1 >> 0x38);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = dVar1;
      auVar11[0xc] = (char)((ulong)dVar1 >> 0x30);
      auVar11._13_2_ = auVar10._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = dVar1;
      auVar12._12_3_ = auVar11._12_3_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = dVar1;
      auVar13[10] = (char)((ulong)dVar1 >> 0x28);
      auVar13._11_4_ = auVar12._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = dVar1;
      auVar14._10_5_ = auVar13._10_5_;
      auVar15[8] = (char)((ulong)dVar1 >> 0x20);
      auVar15._0_8_ = dVar1;
      auVar15._9_6_ = auVar14._9_6_;
      auVar24[7] = 0;
      auVar24._0_7_ = auVar15._8_7_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar15._8_7_;
      auVar20._1_8_ = SUB158(auVar18 << 0x40,7);
      auVar20[0] = (char)((ulong)dVar1 >> 0x18);
      auVar20._9_6_ = 0;
      auVar19._1_10_ = SUB1510(auVar20 << 0x30,5);
      auVar19[0] = (char)((ulong)dVar1 >> 0x10);
      auVar21._11_4_ = 0;
      auVar21._0_11_ = auVar19;
      auVar16[2] = (char)((ulong)dVar1 >> 8);
      auVar16._0_2_ = SUB82(dVar1,0);
      auVar16._3_12_ = SUB1512(auVar21 << 0x20,3);
      auVar17._2_13_ = auVar16._2_13_;
      auVar17._0_2_ = SUB82(dVar1,0) & 0xff;
      auVar24._8_4_ = auVar17._0_4_;
      auVar24._12_4_ = auVar19._0_4_;
      auVar24 = pshuflw(auVar24,auVar24,0x1b);
      auVar24 = pshufhw(auVar24,auVar24,0x1b);
      sVar2 = auVar24._0_2_;
      sVar3 = auVar24._2_2_;
      sVar4 = auVar24._4_2_;
      sVar5 = auVar24._6_2_;
      sVar6 = auVar24._8_2_;
      sVar7 = auVar24._10_2_;
      sVar8 = auVar24._12_2_;
      sVar9 = auVar24._14_2_;
      p[sVar23] = (double)CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar24[0xe] - (0xff < sVar9),
                                   CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar24[0xc] -
                                            (0xff < sVar8),
                                            CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar24[10] -
                                                     (0xff < sVar7),
                                                     CONCAT14((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar24[8] - (0xff < sVar6),
                                                              CONCAT13((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar24[6] - (0xff < sVar5)
                                                                       ,CONCAT12((0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar24[4] -
                                                                                 (0xff < sVar4),
                                                                                 CONCAT11((0 < sVar3
                                                                                          ) * (sVar3
                                                                                              < 
                                                  0x100) * auVar24[2] - (0xff < sVar3),
                                                  (0 < sVar2) * (sVar2 < 0x100) * auVar24[0] -
                                                  (0xff < sVar2))))))));
      sVar23 = sVar23 + 1;
    } while (count != sVar23);
  }
  return sVar22 == count_00;
}

Assistant:

bool
ON_BinaryArchive::ReadDouble(  // Read an array of IEEE 64 bit doubles
		size_t count,       // number of unsigned chars to read
		double* p
		)
{
  bool rc = ReadByte( count<<3, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b=(unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[7]; b[7] = c;
			c = b[1]; b[1] = b[6]; b[6] = c;
			c = b[2]; b[2] = b[5]; b[5] = c;
			c = b[3]; b[3] = b[4]; b[4] = c;
			b += 8;
		}
  }
  return rc;
}